

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void anon_unknown.dwarf_d1289::WriteChannelInfo
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *data,
               vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
               *channels)

{
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  size_t sVar4;
  void *__src;
  const_reference pvVar5;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  *in_RSI;
  int ySampling;
  int xSampling;
  int pixelType;
  size_t c_1;
  uchar *p;
  size_t c;
  size_t sz;
  size_type in_stack_ffffffffffffff98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffa0;
  uint *__dest;
  ulong uVar6;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  uint uVar7;
  uint local_38;
  uint local_34;
  ulong local_30;
  uint *local_28;
  ulong local_20;
  long local_18;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  *local_10;
  
  local_18 = 0;
  local_20 = 0;
  local_10 = in_RSI;
  while (uVar6 = local_20,
        sVar2 = std::
                vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                ::size(local_10), uVar6 < sVar2) {
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::operator[](local_10,local_20);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    sVar4 = strlen(pcVar3);
    local_18 = sVar4 + local_18 + 0x11;
    local_20 = local_20 + 1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),uVar6);
  local_28 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  for (local_30 = 0; uVar6 = local_30,
      sVar2 = std::
              vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
              ::size(local_10), uVar6 < sVar2; local_30 = local_30 + 1) {
    __dest = local_28;
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::operator[](local_10,local_30);
    __src = (void *)std::__cxx11::string::c_str();
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::operator[](local_10,local_30);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    sVar4 = strlen(pcVar3);
    memcpy(__dest,__src,sVar4);
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::operator[](local_10,local_30);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    sVar4 = strlen(pcVar3);
    *(reference)(sVar4 + (long)local_28) = '\0';
    local_28 = (uint *)((reference)(sVar4 + (long)local_28) + 1);
    pvVar5 = std::
             vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
             ::operator[](local_10,local_30);
    local_34 = pvVar5->pixelType;
    pvVar5 = std::
             vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
             ::operator[](local_10,local_30);
    local_38 = pvVar5->xSampling;
    pvVar5 = std::
             vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
             ::operator[](local_10,local_30);
    uVar7 = pvVar5->ySampling;
    bVar1 = IsBigEndian();
    if (bVar1) {
      swap4(&local_34);
      swap4(&local_38);
      swap4((uint *)&stack0xffffffffffffffc4);
    }
    *local_28 = local_34;
    local_28 = local_28 + 1;
    pvVar5 = std::
             vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
             ::operator[](local_10,local_30);
    *(uchar *)local_28 = pvVar5->pLinear;
    local_28[1] = local_38;
    local_28[2] = uVar7;
    local_28 = local_28 + 3;
  }
  *(value_type *)local_28 = '\0';
  return;
}

Assistant:

void WriteChannelInfo(std::vector<unsigned char> &data,
                      const std::vector<ChannelInfo> &channels) {

  size_t sz = 0;

  // Calculate total size.
  for (size_t c = 0; c < channels.size(); c++) {
    sz += strlen(channels[c].name.c_str()) + 1; // +1 for \0
    sz += 16;                                   // 4 * int
  }
  data.resize(sz + 1);

  unsigned char *p = &data.at(0);

  for (size_t c = 0; c < channels.size(); c++) {
    memcpy(p, channels[c].name.c_str(), strlen(channels[c].name.c_str()));
    p += strlen(channels[c].name.c_str());
    (*p) = '\0';
    p++;

    int pixelType = channels[c].pixelType;
    int xSampling = channels[c].xSampling;
    int ySampling = channels[c].ySampling;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&pixelType));
      swap4(reinterpret_cast<unsigned int *>(&xSampling));
      swap4(reinterpret_cast<unsigned int *>(&ySampling));
    }

    memcpy(p, &pixelType, sizeof(int));
    p += sizeof(int);

    (*p) = channels[c].pLinear;
    p += 4;

    memcpy(p, &xSampling, sizeof(int));
    p += sizeof(int);

    memcpy(p, &ySampling, sizeof(int));
    p += sizeof(int);
  }

  (*p) = '\0';
}